

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O1

int SUNLinSolSolve_SPBCGS(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,realtype delta)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  N_Vector y;
  N_Vector z;
  N_Vector z_00;
  N_Vector z_01;
  N_Vector z_02;
  N_Vector x_00;
  N_Vector y_00;
  undefined8 uVar4;
  undefined8 uVar5;
  code *pcVar6;
  code *pcVar7;
  N_Vector x_01;
  N_Vector x_02;
  uint uVar8;
  int iVar9;
  bool bVar10;
  ulong uVar11;
  realtype rVar12;
  double dVar13;
  undefined8 extraout_XMM0_Qb;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined1 auVar16 [16];
  N_Vector Xv [3];
  realtype cv [3];
  double local_d8;
  N_Vector local_c8;
  N_Vector local_c0;
  N_Vector local_b8;
  realtype local_a8;
  double local_a0;
  double local_98;
  undefined1 local_88 [16];
  ulong local_78;
  ulong local_70;
  N_Vector local_68;
  N_Vector local_60;
  double local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  
  if (S == (SUNLinearSolver)0x0) {
    uVar11 = 0xffffffff;
    goto LAB_00102da2;
  }
  piVar3 = (int *)S->content;
  iVar1 = *piVar3;
  uVar2 = piVar3[1];
  y = *(N_Vector *)(piVar3 + 0x18);
  local_60 = *(N_Vector *)(piVar3 + 0x16);
  z = *(N_Vector *)(piVar3 + 0x1a);
  z_00 = *(N_Vector *)(piVar3 + 0x1c);
  local_68 = *(N_Vector *)(piVar3 + 0x1e);
  z_01 = *(N_Vector *)(piVar3 + 0x20);
  z_02 = *(N_Vector *)(piVar3 + 0x22);
  x_00 = *(N_Vector *)(piVar3 + 0x12);
  y_00 = *(N_Vector *)(piVar3 + 0x14);
  uVar4 = *(undefined8 *)(piVar3 + 10);
  uVar5 = *(undefined8 *)(piVar3 + 0x10);
  pcVar6 = *(code **)(piVar3 + 8);
  pcVar7 = *(code **)(piVar3 + 0xe);
  piVar3[2] = 0;
  rVar12 = N_VDotProd(x,x);
  if ((rVar12 != 0.0) || (NAN(rVar12))) {
    iVar9 = (*pcVar6)(uVar4,x,y);
    if (iVar9 == 0) {
      N_VLinearSum(1.0,b,-1.0,y,y);
      goto LAB_0010268e;
    }
LAB_00102703:
    uVar11 = (long)(iVar9 >> 0x1f) ^ 3;
  }
  else {
    N_VScale(1.0,b,y);
LAB_0010268e:
    x_02 = local_60;
    uVar8 = uVar2 | 2;
    if (uVar8 != 3) {
      N_VScale(1.0,y,local_60);
LAB_00102736:
      if (x_00 == (N_Vector)0x0) {
        N_VScale(1.0,x_02,y);
      }
      else {
        N_VProd(x_00,x_02,y);
      }
      rVar12 = N_VDotProd(y,y);
      dVar13 = 0.0;
      if (0.0 < rVar12) {
        if (rVar12 < 0.0) {
          dVar13 = sqrt(rVar12);
        }
        else {
          dVar13 = SQRT(rVar12);
        }
      }
      *(double *)(piVar3 + 4) = dVar13;
      if (dVar13 <= delta) {
        *(undefined8 *)((long)S->content + 0x18) = 0;
        uVar11 = 0;
        goto LAB_00102da2;
      }
      N_VScale(1.0,y,x_02);
      N_VScale(1.0,y,z);
      bVar10 = 0 < iVar1;
      local_d8 = dVar13;
      if (0 < iVar1) {
        local_78 = (ulong)(uint)-iVar1;
        uVar11 = 1;
        uVar14 = SUB84(rVar12,0);
        uVar15 = (undefined4)((ulong)rVar12 >> 0x20);
        do {
          piVar3[2] = piVar3[2] + 1;
          local_70 = uVar11;
          if (y_00 == (N_Vector)0x0) {
            N_VScale(1.0,z,z_02);
          }
          else {
            N_VDiv(z,y_00,z_02);
          }
          if ((uVar2 & 0xfffffffe) == 2) {
            N_VScale(1.0,z_02,z_01);
            iVar9 = (*pcVar7)(delta,uVar5,z_01,z_02,2);
            if (iVar9 != 0) goto LAB_001026d8;
          }
          iVar9 = (*pcVar6)(uVar4,z_02,z_01);
          if (iVar9 != 0) goto LAB_00102703;
          if (uVar8 == 3) {
            iVar9 = (*pcVar7)(delta,uVar5,z_01,z_02,1);
            if (iVar9 != 0) goto LAB_001026d8;
          }
          else {
            N_VScale(1.0,z_01,z_02);
          }
          if (x_00 == (N_Vector)0x0) {
            N_VScale(1.0,z_02,z_01);
          }
          else {
            N_VProd(x_00,z_02,z_01);
          }
          rVar12 = N_VDotProd(z_01,y);
          local_58 = (double)CONCAT44(uVar15,uVar14) / rVar12;
          uStack_50 = 0;
          rVar12 = (realtype)((ulong)local_58 ^ (ulong)DAT_00105020);
          local_48._8_4_ = DAT_00105020._8_4_;
          local_48._0_8_ = rVar12;
          local_48._12_4_ = DAT_00105020._12_4_;
          N_VLinearSum(1.0,x_02,rVar12,z_01,z_00);
          if (y_00 == (N_Vector)0x0) {
            N_VScale(1.0,z_00,z_02);
          }
          else {
            N_VDiv(z_00,y_00,z_02);
          }
          x_01 = local_68;
          if ((uVar2 & 0xfffffffe) == 2) {
            N_VScale(1.0,z_02,local_68);
            iVar9 = (*pcVar7)(delta,uVar5,x_01,z_02,2);
            if (iVar9 != 0) goto LAB_001026d8;
          }
          iVar9 = (*pcVar6)(uVar4,z_02,x_01);
          if (iVar9 != 0) goto LAB_00102703;
          if (uVar8 == 3) {
            iVar9 = (*pcVar7)(delta,uVar5,x_01,z_02,1);
            if (iVar9 != 0) goto LAB_001026d8;
          }
          else {
            N_VScale(1.0,x_01,z_02);
          }
          if (x_00 == (N_Vector)0x0) {
            N_VScale(1.0,z_02,x_01);
          }
          else {
            N_VProd(x_00,z_02,x_01);
          }
          rVar12 = N_VDotProd(x_01,x_01);
          auVar16._0_8_ = ~-(ulong)(rVar12 == 0.0) & (ulong)rVar12;
          auVar16._8_8_ = 0;
          local_88 = auVar16 | ZEXT416((uint)(-(ulong)(rVar12 == 0.0) >> 0x20) & 0x3ff00000) << 0x20
          ;
          rVar12 = N_VDotProd(x_01,z_00);
          local_98 = rVar12 / (double)local_88._0_8_;
          local_a8 = 1.0;
          local_a0 = local_58;
          local_88._8_4_ = (int)extraout_XMM0_Qb;
          local_88._0_8_ = local_98;
          local_88._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
          local_c8 = x;
          local_c0 = z;
          local_b8 = z_00;
          iVar9 = N_VLinearCombination(3,&local_a8,&local_c8,x);
          uVar11 = 0xfffffff6;
          if (iVar9 != 0) goto LAB_00102da2;
          N_VLinearSum(1.0,z_00,-(double)local_88._0_8_,x_01,x_02);
          rVar12 = N_VDotProd(x_02,x_02);
          local_d8 = 0.0;
          if (0.0 < rVar12) {
            rVar12 = N_VDotProd(x_02,x_02);
            if (rVar12 < 0.0) {
              local_d8 = sqrt(rVar12);
            }
            else {
              local_d8 = SQRT(rVar12);
            }
          }
          *(double *)(piVar3 + 4) = local_d8;
          if (local_d8 <= delta) break;
          rVar12 = N_VDotProd(x_02,y);
          local_a0 = rVar12 / (double)CONCAT44(uVar15,uVar14);
          local_a8 = (local_58 / (double)local_88._0_8_) * local_a0;
          local_a0 = local_a0 * (double)local_48._0_8_;
          local_98 = 1.0;
          local_b8 = x_02;
          local_c8 = z;
          local_c0 = z_01;
          iVar9 = N_VLinearCombination(3,&local_a8,&local_c8,z);
          if (iVar9 != 0) goto LAB_00102da2;
          iVar9 = (int)local_70;
          bVar10 = iVar9 < iVar1;
          uVar11 = (ulong)(iVar9 + 1);
          uVar14 = SUB84(rVar12,0);
          uVar15 = (undefined4)((ulong)rVar12 >> 0x20);
        } while ((int)local_78 + iVar9 != 0);
      }
      if ((bVar10 == false) && (dVar13 <= local_d8)) {
        *(undefined8 *)((long)S->content + 0x18) = 2;
        uVar11 = 2;
        goto LAB_00102da2;
      }
      if (y_00 != (N_Vector)0x0) {
        N_VDiv(x,y_00,x);
      }
      if ((uVar2 & 0xfffffffe) == 2) {
        iVar9 = (*pcVar7)(delta,uVar5,x,z_02,2);
        if (iVar9 != 0) goto LAB_001026d8;
        N_VScale(1.0,z_02,x);
      }
      *(ulong *)((long)S->content + 0x18) = (ulong)(bVar10 ^ 1U);
      uVar11 = (ulong)(bVar10 ^ 1U);
      goto LAB_00102da2;
    }
    iVar9 = (*pcVar7)(delta,uVar5,y,local_60,1);
    if (iVar9 == 0) goto LAB_00102736;
LAB_001026d8:
    uVar11 = (long)(iVar9 >> 0x1f) ^ 5;
  }
  *(ulong *)((long)S->content + 0x18) = uVar11;
LAB_00102da2:
  return (int)uVar11;
}

Assistant:

int SUNLinSolSolve_SPBCGS(SUNLinearSolver S, SUNMatrix A, N_Vector x, 
                          N_Vector b, realtype delta)
{
  /* local data and shortcut variables */
  realtype alpha, beta, omega, omega_denom, beta_num, beta_denom, r_norm, rho;
  N_Vector r_star, r, p, q, u, Ap, vtemp;
  booleantype preOnLeft, preOnRight, scale_x, scale_b, converged;
  int l, l_max, ier;
  void *A_data, *P_data;
  N_Vector sx, sb;
  ATimesFn atimes;
  PSolveFn psolve;
  realtype *res_norm;
  int *nli;

  /* local variables for fused vector operations */
  realtype cv[3];
  N_Vector Xv[3];
  
  /* Make local shorcuts to solver variables. */
  if (S == NULL) return(SUNLS_MEM_NULL);
  l_max        = SPBCGS_CONTENT(S)->maxl;
  r_star       = SPBCGS_CONTENT(S)->r_star;
  r            = SPBCGS_CONTENT(S)->r;
  p            = SPBCGS_CONTENT(S)->p;
  q            = SPBCGS_CONTENT(S)->q;
  u            = SPBCGS_CONTENT(S)->u;
  Ap           = SPBCGS_CONTENT(S)->Ap;
  vtemp        = SPBCGS_CONTENT(S)->vtemp;
  sb           = SPBCGS_CONTENT(S)->s1;
  sx           = SPBCGS_CONTENT(S)->s2;
  A_data       = SPBCGS_CONTENT(S)->ATData;
  P_data       = SPBCGS_CONTENT(S)->PData;
  atimes       = SPBCGS_CONTENT(S)->ATimes;
  psolve       = SPBCGS_CONTENT(S)->Psolve;
  nli          = &(SPBCGS_CONTENT(S)->numiters);
  res_norm     = &(SPBCGS_CONTENT(S)->resnorm);

  /* Initialize counters and convergence flag */
  *nli = 0;
  converged = SUNFALSE;

  /* set booleantype flags for internal solver options */
  preOnLeft  = ( (PRETYPE(S) == PREC_LEFT) || 
                 (PRETYPE(S) == PREC_BOTH) );
  preOnRight = ( (PRETYPE(S) == PREC_RIGHT) || 
                 (PRETYPE(S) == PREC_BOTH) );
  scale_x = (sx != NULL);
  scale_b = (sb != NULL);

  /* Set r_star to initial (unscaled) residual r_0 = b - A*x_0 */

  if (N_VDotProd(x, x) == ZERO) N_VScale(ONE, b, r_star);
  else {
    ier = atimes(A_data, x, r_star);
    if (ier != 0) {
      LASTFLAG(S) = (ier < 0) ?
        SUNLS_ATIMES_FAIL_UNREC : SUNLS_ATIMES_FAIL_REC;
      return(LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, r_star, r_star);
  }

  /* Apply left preconditioner and b-scaling to r_star = r_0 */

  if (preOnLeft) {
    ier = psolve(P_data, r_star, r, delta, PREC_LEFT);
    if (ier != 0) {
      LASTFLAG(S) = (ier < 0) ?
        SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
      return(LASTFLAG(S));
    }
  }
  else N_VScale(ONE, r_star, r);

  if (scale_b) N_VProd(sb, r, r_star);
  else N_VScale(ONE, r, r_star);

  /* Initialize beta_denom to the dot product of r0 with r0 */

  beta_denom = N_VDotProd(r_star, r_star);

  /* Set r_norm to L2 norm of r_star = sb P1_inv r_0, and
     return if small */

  *res_norm = r_norm = rho = SUNRsqrt(beta_denom);
  if (r_norm <= delta) {
    LASTFLAG(S) = SUNLS_SUCCESS;
    return(LASTFLAG(S));
  }

  /* Copy r_star to r and p */

  N_VScale(ONE, r_star, r);
  N_VScale(ONE, r_star, p);

  /* Begin main iteration loop */

  for(l = 0; l < l_max; l++) {

    (*nli)++;

    /* Generate Ap = A-tilde p, where A-tilde = sb P1_inv A P2_inv sx_inv */

    /*   Apply x-scaling: vtemp = sx_inv p */

    if (scale_x) N_VDiv(p, sx, vtemp);
    else N_VScale(ONE, p, vtemp);

    /*   Apply right preconditioner: vtemp = P2_inv sx_inv p */

    if (preOnRight) {
      N_VScale(ONE, vtemp, Ap);
      ier = psolve(P_data, Ap, vtemp, delta, PREC_RIGHT);
      if (ier != 0) {
        LASTFLAG(S) = (ier < 0) ?
          SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
        return(LASTFLAG(S));
      }
    }

    /*   Apply A: Ap = A P2_inv sx_inv p */

    ier = atimes(A_data, vtemp, Ap );
    if (ier != 0) {
      LASTFLAG(S) = (ier < 0) ?
        SUNLS_ATIMES_FAIL_UNREC : SUNLS_ATIMES_FAIL_REC;
      return(LASTFLAG(S));
    }

    /*   Apply left preconditioner: vtemp = P1_inv A P2_inv sx_inv p */

    if (preOnLeft) {
      ier = psolve(P_data, Ap, vtemp, delta, PREC_LEFT);
      if (ier != 0) {
        LASTFLAG(S) = (ier < 0) ?
          SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
        return(LASTFLAG(S));
      }
    }
    else N_VScale(ONE, Ap, vtemp);

    /*   Apply b-scaling: Ap = sb P1_inv A P2_inv sx_inv p */

    if (scale_b) N_VProd(sb, vtemp, Ap);
    else N_VScale(ONE, vtemp, Ap);


    /* Calculate alpha = <r,r_star>/<Ap,r_star> */

    alpha = ((beta_denom / N_VDotProd(Ap, r_star)));

    /* Update q = r - alpha*Ap = r - alpha*(sb P1_inv A P2_inv sx_inv p) */

    N_VLinearSum(ONE, r, -alpha, Ap, q);

    /* Generate u = A-tilde q */

    /*   Apply x-scaling: vtemp = sx_inv q */

    if (scale_x) N_VDiv(q, sx, vtemp);
    else N_VScale(ONE, q, vtemp);

    /*   Apply right preconditioner: vtemp = P2_inv sx_inv q */

    if (preOnRight) {
      N_VScale(ONE, vtemp, u);
      ier = psolve(P_data, u, vtemp, delta, PREC_RIGHT);
      if (ier != 0) {
        LASTFLAG(S) = (ier < 0) ?
          SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
        return(LASTFLAG(S));
      }
    }

    /*   Apply A: u = A P2_inv sx_inv u */

    ier = atimes(A_data, vtemp, u );
    if (ier != 0) {
      LASTFLAG(S) = (ier < 0) ?
        SUNLS_ATIMES_FAIL_UNREC : SUNLS_ATIMES_FAIL_REC;
      return(LASTFLAG(S));
    }

    /*   Apply left preconditioner: vtemp = P1_inv A P2_inv sx_inv p */

    if (preOnLeft) {
      ier = psolve(P_data, u, vtemp, delta, PREC_LEFT);
      if (ier != 0) {
        LASTFLAG(S) = (ier < 0) ?
          SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
        return(LASTFLAG(S));
      }
    }
    else N_VScale(ONE, u, vtemp);

    /*   Apply b-scaling: u = sb P1_inv A P2_inv sx_inv u */

    if (scale_b) N_VProd(sb, vtemp, u);
    else N_VScale(ONE, vtemp, u);


    /* Calculate omega = <u,q>/<u,u> */

    omega_denom = N_VDotProd(u, u);
    if (omega_denom == ZERO) omega_denom = ONE;
    omega = (N_VDotProd(u, q) / omega_denom);

    /* Update x = x + alpha*p + omega*q */
    cv[0] = ONE;
    Xv[0] = x;

    cv[1] = alpha;
    Xv[1] = p;

    cv[2] = omega;
    Xv[2] = q;

    ier = N_VLinearCombination(3, cv, Xv, x);
    if (ier != SUNLS_SUCCESS) return(SUNLS_VECTOROP_ERR);

    /* Update the residual r = q - omega*u */

    N_VLinearSum(ONE, q, -omega, u, r);

    /* Set rho = norm(r) and check convergence */

    *res_norm = rho = SUNRsqrt(N_VDotProd(r, r));
    if (rho <= delta) {
      converged = SUNTRUE;
      break;
    }

    /* Not yet converged, continue iteration */
    /* Update beta = <rnew,r_star> / <rold,r_start> * alpha / omega */

    beta_num = N_VDotProd(r, r_star);
    beta = ((beta_num / beta_denom) * (alpha / omega));

    /* Update p = r + beta*(p - omega*Ap) = beta*p - beta*omega*Ap + r */
    cv[0] = beta;
    Xv[0] = p;

    cv[1] = -alpha*(beta_num / beta_denom);
    Xv[1] = Ap;

    cv[2] = ONE;
    Xv[2] = r;

    ier = N_VLinearCombination(3, cv, Xv, p);
    if (ier != SUNLS_SUCCESS) return(SUNLS_VECTOROP_ERR);

    /* udpate beta_denom for next iteration */
    beta_denom = beta_num;
  }

  /* Main loop finished */

  if ((converged == SUNTRUE) || (rho < r_norm)) {

    /* Apply the x-scaling and right preconditioner: x = P2_inv sx_inv x */

    if (scale_x) N_VDiv(x, sx, x);
    if (preOnRight) {
      ier = psolve(P_data, x, vtemp, delta, PREC_RIGHT);
      if (ier != 0) {
        LASTFLAG(S) = (ier < 0) ?
          SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
        return(LASTFLAG(S));
      }
      N_VScale(ONE, vtemp, x);
    }

    if (converged == SUNTRUE) 
      LASTFLAG(S) = SUNLS_SUCCESS;
    else 
      LASTFLAG(S) = SUNLS_RES_REDUCED;
    return(LASTFLAG(S));
    
  }
  else {
    LASTFLAG(S) = SUNLS_CONV_FAIL;
    return(LASTFLAG(S));
  }
}